

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O0

void __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::add_two_to_empty(basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                   *this,byte key1,node_ptr child1,byte key2,db_leaf_unique_ptr *child2)

{
  byte bVar1;
  uchar uVar2;
  byte bVar3;
  bool bVar4;
  reference pvVar5;
  reference pvVar6;
  pointer ptr;
  const_iterator __first;
  const_iterator pvVar7;
  key_union *this_00;
  basic_node_ptr<unodb::detail::node_header> local_40;
  basic_node_ptr<unodb::detail::node_header> local_38;
  byte local_2a;
  byte local_29;
  uint8_t key2_i;
  db_leaf_unique_ptr *pdStack_28;
  uint8_t key1_i;
  db_leaf_unique_ptr *child2_local;
  byte key2_local;
  basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *pbStack_18;
  byte key1_local;
  basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *this_local;
  node_ptr child1_local;
  
  pdStack_28 = child2;
  child2_local._6_1_ = key2;
  child2_local._7_1_ = key1;
  pbStack_18 = this;
  this_local = (basic_inode_4<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                *)child1.tagged_ptr;
  if (key1 == key2) {
    __assert_fail("key1 != key2",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                  ,0x666,
                  "void unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::add_two_to_empty(std::byte, node_ptr, std::byte, db_leaf_unique_ptr) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                 );
  }
  uVar2 = in_fake_critical_section::operator_cast_to_unsigned_char
                    ((in_fake_critical_section *)&this->field_0x8);
  bVar1 = child2_local._7_1_;
  if (uVar2 == '\x02') {
    local_29 = child2_local._6_1_ <= child2_local._7_1_;
    local_2a = 1 - local_29;
    this_00 = &this->keys;
    pvVar5 = std::array<unodb::in_fake_critical_section<std::byte>,_4UL>::operator[]
                       (&this_00->byte_array,(ulong)local_29);
    in_fake_critical_section<std::byte>::operator=(pvVar5,bVar1);
    local_38.tagged_ptr = (uintptr_t)this_local;
    pvVar6 = std::
             array<unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>,_4UL>
             ::operator[](&this->children,(ulong)local_29);
    in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>::operator=
              (pvVar6,local_38);
    bVar1 = child2_local._6_1_;
    pvVar5 = std::array<unodb::in_fake_critical_section<std::byte>,_4UL>::operator[]
                       (&this_00->byte_array,(ulong)local_2a);
    in_fake_critical_section<std::byte>::operator=(pvVar5,bVar1);
    ptr = std::
          unique_ptr<unodb::detail::basic_leaf<unsigned_long,_unodb::detail::node_header>,_unodb::detail::basic_db_leaf_deleter<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
          ::release(child2);
    basic_node_ptr<unodb::detail::node_header>::basic_node_ptr(&local_40,(header_type *)ptr,LEAF);
    pvVar6 = std::
             array<unodb::in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>,_4UL>
             ::operator[](&this->children,(ulong)local_2a);
    in_fake_critical_section<unodb::detail::basic_node_ptr<unodb::detail::node_header>_>::operator=
              (pvVar6,local_40);
    __first = std::array<unodb::in_fake_critical_section<std::byte>,_4UL>::cbegin
                        (&this_00->byte_array);
    pvVar7 = std::array<unodb::in_fake_critical_section<std::byte>,_4UL>::cbegin
                       (&this_00->byte_array);
    bVar3 = in_fake_critical_section::operator_cast_to_unsigned_char
                      ((in_fake_critical_section *)&this->field_0x8);
    bVar4 = std::is_sorted<unodb::in_fake_critical_section<std::byte>const*>(__first,pvVar7 + bVar3)
    ;
    if (!bVar4) {
      __assert_fail("std::is_sorted(keys.byte_array.cbegin(), keys.byte_array.cbegin() + this->children_count)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                    ,0x676,
                    "void unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::add_two_to_empty(std::byte, node_ptr, std::byte, db_leaf_unique_ptr) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
                   );
    }
    return;
  }
  __assert_fail("this->children_count == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./art_internal_impl.hpp"
                ,0x667,
                "void unodb::detail::basic_inode_4<unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>>::add_two_to_empty(std::byte, node_ptr, std::byte, db_leaf_unique_ptr) [ArtPolicy = unodb::detail::basic_art_policy<unsigned long, std::span<const std::byte>, unodb::db, unodb::in_fake_critical_section, unodb::fake_lock, unodb::fake_read_critical_section, unodb::detail::basic_node_ptr<unodb::detail::node_header>, unodb::detail::inode_defs, unodb::detail::db_inode_deleter, unodb::detail::basic_db_leaf_deleter>]"
               );
}

Assistant:

constexpr void add_two_to_empty(std::byte key1, node_ptr child1,
                                  std::byte key2,
                                  db_leaf_unique_ptr child2) noexcept {
    UNODB_DETAIL_ASSERT(key1 != key2);
    UNODB_DETAIL_ASSERT(this->children_count == 2);

    const std::uint8_t key1_i = key1 < key2 ? 0U : 1U;
    const std::uint8_t key2_i = 1U - key1_i;
    keys.byte_array[key1_i] = key1;
    children[key1_i] = child1;
    keys.byte_array[key2_i] = key2;
    children[key2_i] = node_ptr{child2.release(), node_type::LEAF};
#ifndef UNODB_DETAIL_X86_64
    keys.byte_array[2] = unused_key_byte;
    keys.byte_array[3] = unused_key_byte;
#endif

    UNODB_DETAIL_ASSERT(
        std::is_sorted(keys.byte_array.cbegin(),
                       keys.byte_array.cbegin() + this->children_count));
  }